

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O0

void Average2_uint32_SSE2(uint32_t a0,uint32_t a1,__m128i *avg)

{
  char cVar1;
  char cVar3;
  char cVar4;
  char cVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  ulong uVar2;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 local_a8;
  undefined1 uStack_a7;
  undefined1 uStack_a6;
  undefined1 uStack_a5;
  undefined1 local_98;
  undefined1 uStack_97;
  undefined1 uStack_96;
  undefined1 uStack_95;
  __m128i one;
  __m128i avg1;
  __m128i A1;
  __m128i A0;
  __m128i ones;
  __m128i *avg_local;
  uint32_t a1_local;
  uint32_t a0_local;
  
  local_98 = (undefined1)a0;
  uStack_97 = (undefined1)(a0 >> 8);
  uStack_96 = (undefined1)(a0 >> 0x10);
  uStack_95 = (undefined1)(a0 >> 0x18);
  local_a8 = (undefined1)a1;
  uStack_a7 = (undefined1)(a1 >> 8);
  uStack_a6 = (undefined1)(a1 >> 0x10);
  uStack_a5 = (undefined1)(a1 >> 0x18);
  cVar1 = pavgb(local_98,local_a8);
  cVar3 = pavgb(uStack_97,uStack_a7);
  cVar4 = pavgb(uStack_96,uStack_a6);
  cVar5 = pavgb(uStack_95,uStack_a5);
  uVar6 = pavgb(0,0);
  uVar7 = pavgb(0,0);
  uVar8 = pavgb(0,0);
  uVar9 = pavgb(0,0);
  uVar10 = pavgb(0,0);
  uVar11 = pavgb(0,0);
  uVar12 = pavgb(0,0);
  uVar13 = pavgb(0,0);
  uVar14 = pavgb(0,0);
  uVar15 = pavgb(0,0);
  uVar16 = pavgb(0,0);
  uVar17 = pavgb(0,0);
  uVar2 = (ulong)(a0 ^ a1) & 0x1010101010101;
  A0[1]._0_1_ = (char)uVar2;
  A0[1]._1_1_ = (char)(uVar2 >> 8);
  A0[1]._2_1_ = (char)(uVar2 >> 0x10);
  A0[1]._3_1_ = (char)(uVar2 >> 0x18);
  *(char *)*avg = cVar1 - (char)A0[1];
  *(char *)((long)*avg + 1) = cVar3 - A0[1]._1_1_;
  *(char *)((long)*avg + 2) = cVar4 - A0[1]._2_1_;
  *(char *)((long)*avg + 3) = cVar5 - A0[1]._3_1_;
  *(undefined1 *)((long)*avg + 4) = uVar6;
  *(undefined1 *)((long)*avg + 5) = uVar7;
  *(undefined1 *)((long)*avg + 6) = uVar8;
  *(undefined1 *)((long)*avg + 7) = uVar9;
  *(undefined1 *)(*avg + 1) = uVar10;
  *(undefined1 *)((long)*avg + 9) = uVar11;
  *(undefined1 *)((long)*avg + 10) = uVar12;
  *(undefined1 *)((long)*avg + 0xb) = uVar13;
  *(undefined1 *)((long)*avg + 0xc) = uVar14;
  *(undefined1 *)((long)*avg + 0xd) = uVar15;
  *(undefined1 *)((long)*avg + 0xe) = uVar16;
  *(undefined1 *)((long)*avg + 0xf) = uVar17;
  return;
}

Assistant:

static WEBP_INLINE void Average2_uint32_SSE2(const uint32_t a0,
                                             const uint32_t a1,
                                             __m128i* const avg) {
  // (a + b) >> 1 = ((a + b + 1) >> 1) - ((a ^ b) & 1)
  const __m128i ones = _mm_set1_epi8(1);
  const __m128i A0 = _mm_cvtsi32_si128((int)a0);
  const __m128i A1 = _mm_cvtsi32_si128((int)a1);
  const __m128i avg1 = _mm_avg_epu8(A0, A1);
  const __m128i one = _mm_and_si128(_mm_xor_si128(A0, A1), ones);
  *avg = _mm_sub_epi8(avg1, one);
}